

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O3

void basisu::etc_block::unpack_delta3(int *r,int *g,int *b,uint16_t packed_delta3)

{
  *r = packed_delta3 >> 6 & 7;
  *g = packed_delta3 >> 3 & 7;
  *b = packed_delta3 & 7;
  if (3 < *r) {
    *r = *r + -8;
  }
  if (3 < *g) {
    *g = *g + -8;
  }
  if (3 < *b) {
    *b = *b + -8;
  }
  return;
}

Assistant:

void etc_block::unpack_delta3(int& r, int& g, int& b, uint16_t packed_delta3)
	{
		r = (packed_delta3 >> 6) & 7;
		g = (packed_delta3 >> 3) & 7;
		b = packed_delta3 & 7;
		if (r >= 4) r -= 8;
		if (g >= 4) g -= 8;
		if (b >= 4) b -= 8;
	}